

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenFactory.cpp
# Opt level: O3

ParenToken * __thiscall
xercesc_4_0::TokenFactory::createParenthesis(TokenFactory *this,Token *token,int noGroups)

{
  BaseRefVectorOf<xercesc_4_0::Token> *this_00;
  XMLSize_t XVar1;
  ParenToken *this_01;
  
  this_01 = (ParenToken *)XMemory::operator_new(0x28,this->fMemoryManager);
  ParenToken::ParenToken(this_01,T_PAREN,token,noGroups,this->fMemoryManager);
  this_00 = &this->fTokens->super_BaseRefVectorOf<xercesc_4_0::Token>;
  BaseRefVectorOf<xercesc_4_0::Token>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (Token *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

ParenToken* TokenFactory::createParenthesis(Token* const token,
                                            const int noGroups) {

    ParenToken* tmpTok = new (fMemoryManager) ParenToken(Token::T_PAREN, token, noGroups, fMemoryManager);

    fTokens->addElement(tmpTok);
    return tmpTok;
}